

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Track::Track(Track *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  Track *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericTrack::GenericTrack(&this->super_GenericTrack,d);
  (this->super_GenericTrack).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Track_0033a1b8;
  Rational::Rational(&this->EditRate);
  this->Origin = 0;
  if ((this->super_GenericTrack).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericTrack).super_InterchangeObject.m_Dict,MDD_Track);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_GenericTrack).super_InterchangeObject.super_KLVPacket.m_UL,&local_48
                 );
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x370,"ASDCP::MXF::Track::Track(const Dictionary *)");
}

Assistant:

Track::Track(const Dictionary* d) : GenericTrack(d), Origin(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_Track);
}